

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<IdentifierExpressionAstNode>_> * __thiscall
Parser::parseIdentiferExpression
          (optional<std::shared_ptr<IdentifierExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  shared_ptr<IdentifierExpressionAstNode> local_68;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<Token> token;
  bool error;
  Parser *this_local;
  
  token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"Expected an identifer",&local_51);
  expect((Parser *)local_30,(TokenType)this,(bool *)0x18,
         (string *)
         ((long)&token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7))
  ;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::make_shared<IdentifierExpressionAstNode,std::shared_ptr<Token>&>
            ((shared_ptr<Token> *)&local_68);
  std::optional<std::shared_ptr<IdentifierExpressionAstNode>_>::
  optional<std::shared_ptr<IdentifierExpressionAstNode>,_true>(__return_storage_ptr__,&local_68);
  std::shared_ptr<IdentifierExpressionAstNode>::~shared_ptr(&local_68);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<IdentifierExpressionAstNode>>
Parser::parseIdentiferExpression() noexcept {
  bool error = false;
  auto token = this->expect(TokenType::Identifier, error, "Expected an identifer");
  return std::make_shared<IdentifierExpressionAstNode>(token);
}